

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::FullClassName<google::protobuf::EnumDescriptor>
                   (string *__return_storage_ptr__,EnumDescriptor *desc,bool is_descriptor)

{
  bool bVar1;
  string *psVar2;
  FileDescriptor *pFVar3;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined4 local_dc;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  Descriptor *local_48;
  Descriptor *containing;
  string classname;
  bool is_descriptor_local;
  EnumDescriptor *desc_local;
  
  classname.field_2._M_local_buf[0xf] = is_descriptor;
  psVar2 = EnumDescriptor::name_abi_cxx11_(desc);
  std::__cxx11::string::string((string *)&containing,(string *)psVar2);
  for (local_48 = EnumDescriptor::containing_type(desc); local_48 != (Descriptor *)0x0;
      local_48 = Descriptor::containing_type(local_48)) {
    psVar2 = Descriptor::name_abi_cxx11_(local_48);
    std::operator+(&local_98,psVar2,'_');
    std::operator+(&local_78,&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&containing)
    ;
    std::__cxx11::string::operator=((string *)&containing,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
  }
  ClassNamePrefix<google::protobuf::EnumDescriptor>(&local_d8,(string *)&containing,desc);
  std::operator+(&local_b8,&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&containing);
  std::__cxx11::string::operator=((string *)&containing,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  pFVar3 = EnumDescriptor::file(desc);
  psVar2 = FileDescriptor::package_abi_cxx11_(pFVar3);
  bVar1 = std::operator==(psVar2,"");
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&containing);
  }
  else {
    pFVar3 = EnumDescriptor::file(desc);
    psVar2 = FileDescriptor::package_abi_cxx11_(pFVar3);
    PhpName(&local_120,psVar2,(bool)(classname.field_2._M_local_buf[0xf] & 1));
    std::operator+(&local_100,&local_120,'\\');
    std::operator+(__return_storage_ptr__,&local_100,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&containing)
    ;
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
  }
  local_dc = 1;
  std::__cxx11::string::~string((string *)&containing);
  return __return_storage_ptr__;
}

Assistant:

std::string FullClassName(const DescriptorType* desc, bool is_descriptor) {
  string classname = desc->name();
  const Descriptor* containing = desc->containing_type();
  while (containing != NULL) {
    classname = containing->name() + '_' + classname;
    containing = containing->containing_type();
  }
  classname = ClassNamePrefix(classname, desc) + classname;

  if (desc->file()->package() == "") {
    return classname;
  } else {
    return PhpName(desc->file()->package(), is_descriptor) + '\\' +
           classname;
  }
}